

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void launch_dec_workers(AV1Decoder *pbi,uint8_t *data_end,int num_workers)

{
  AVxWorker *pAVar1;
  AVxWorkerInterface *pAVar2;
  long lVar3;
  
  pAVar2 = aom_get_worker_interface();
  lVar3 = (ulong)(uint)num_workers * 0x38;
  for (; 0 < num_workers; num_workers = num_workers + -1) {
    pAVar1 = pbi->tile_workers;
    *(uint8_t **)(*(long *)((long)&pAVar1[-1].data1 + lVar3) + 8) = data_end;
    *(undefined4 *)((long)&pAVar1[-1].had_error + lVar3) = 0;
    (*(&pAVar2->launch)[lVar3 + -0x38 == 0])((AVxWorker *)((long)&pAVar1[-1].impl_ + lVar3));
    lVar3 = lVar3 + -0x38;
  }
  return;
}

Assistant:

static inline void launch_dec_workers(AV1Decoder *pbi, const uint8_t *data_end,
                                      int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  for (int worker_idx = num_workers - 1; worker_idx >= 0; --worker_idx) {
    AVxWorker *const worker = &pbi->tile_workers[worker_idx];
    DecWorkerData *const thread_data = (DecWorkerData *)worker->data1;

    thread_data->data_end = data_end;

    worker->had_error = 0;
    if (worker_idx == 0) {
      winterface->execute(worker);
    } else {
      winterface->launch(worker);
    }
  }
}